

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instance.cpp
# Opt level: O0

Ptr<Instance>
myvk::Instance::Create
          (vector<const_char_*,_std::allocator<const_char_*>_> *f_extensions,
          bool use_validation_layer,PFN_vkDebugUtilsMessengerCallbackEXT debug_callback)

{
  PFN_vkCreateInstance p_Var1;
  PFN_vkCreateDebugUtilsMessengerEXT p_Var2;
  VkResult VVar3;
  size_type sVar4;
  element_type *peVar5;
  long in_RCX;
  byte in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<Instance> PVar6;
  VkDebugUtilsMessengerCreateInfoEXT debug_info;
  VkValidationFeaturesEXT validation_features;
  VkValidationFeatureEnableEXT validation_features_enabled [2];
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  VkInstanceCreateInfo create_info;
  VkApplicationInfo app_info;
  shared_ptr<myvk::Instance> ret;
  shared_ptr<myvk::Instance> *in_stack_fffffffffffffe78;
  VkInstance in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  VkResult in_stack_fffffffffffffe94;
  undefined8 local_148;
  void *pvStack_140;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffec8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffed0;
  undefined4 local_110 [2];
  undefined4 *local_108;
  undefined4 local_100;
  undefined8 *local_f8;
  undefined8 local_e0;
  char *local_d8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_c0;
  VkInstanceCreateInfo local_a8;
  VkApplicationInfo local_68;
  shared_ptr<myvk::Instance> local_30;
  long local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = in_RCX;
  std::make_shared<myvk::Instance>();
  local_68.pEngineName = (char *)0x0;
  local_68.pApplicationName = (char *)0x0;
  local_68.applicationVersion = 0;
  local_68._28_4_ = 0;
  local_68.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_68._4_4_ = 0;
  local_68.pNext = (void *)0x0;
  local_68.engineVersion = 0;
  local_68.apiVersion = 0x403000;
  local_a8.enabledExtensionCount = 0;
  local_a8._52_4_ = 0;
  local_a8.ppEnabledExtensionNames = (char **)0x0;
  local_a8.enabledLayerCount = 0;
  local_a8._36_4_ = 0;
  local_a8.ppEnabledLayerNames = (char **)0x0;
  local_a8.flags = 0;
  local_a8._20_4_ = 0;
  local_a8.pNext = (undefined4 *)0x0;
  local_a8.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_a8._4_4_ = 0;
  local_a8.pApplicationInfo = &local_68;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if ((local_11 & 1) != 0) {
    local_d8 = "VK_EXT_debug_utils";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffe80,
               (value_type *)in_stack_fffffffffffffe78);
  }
  sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_c0);
  local_a8.enabledExtensionCount = (uint32_t)sVar4;
  local_a8.ppEnabledExtensionNames =
       std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x2c059e);
  local_e0 = 0x400000002;
  memset(local_110,0,0x30);
  local_110[0] = 0x3b9e8ed8;
  local_100 = 2;
  local_f8 = &local_e0;
  if ((local_11 & 1) == 0) {
    local_a8._32_8_ = (ulong)(uint)local_a8._36_4_ << 0x20;
  }
  else {
    local_a8.enabledLayerCount = 1;
    local_a8.ppEnabledLayerNames = &kValidationLayers;
    local_108 = (undefined4 *)local_a8.pNext;
    local_a8.pNext = local_110;
  }
  if ((vkCreateInstance == (PFN_vkCreateInstance)0x0) &&
     (VVar3 = volkInitialize(), VVar3 != VK_SUCCESS)) {
    std::shared_ptr<myvk::Instance>::shared_ptr
              ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  else {
    p_Var1 = vkCreateInstance;
    peVar5 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2c0691);
    VVar3 = (*p_Var1)(&local_a8,(VkAllocationCallbacks *)0x0,&peVar5->m_instance);
    if (VVar3 == VK_SUCCESS) {
      std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2c06e2);
      volkLoadInstanceOnly((VkInstance)0x2c06eb);
      p_Var2 = vkCreateDebugUtilsMessengerEXT;
      if (((local_11 & 1) != 0) && (local_20 != 0)) {
        pvStack_140 = (void *)0x0;
        local_148._0_4_ = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
        local_148._4_4_ = 0;
        in_stack_fffffffffffffe78 = &local_30;
        peVar5 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2c076a);
        in_stack_fffffffffffffe80 = peVar5->m_instance;
        peVar5 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2c077c);
        in_stack_fffffffffffffe94 =
             (*p_Var2)(in_stack_fffffffffffffe80,(VkDebugUtilsMessengerCreateInfoEXT *)&local_148,
                       (VkAllocationCallbacks *)0x0,&peVar5->m_debug_messenger);
        if (in_stack_fffffffffffffe94 != VK_SUCCESS) {
          std::shared_ptr<myvk::Instance>::shared_ptr
                    ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe80,
                     in_stack_fffffffffffffe78);
          goto LAB_002c07d9;
        }
      }
      std::shared_ptr<myvk::Instance>::shared_ptr
                ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    else {
      std::shared_ptr<myvk::Instance>::shared_ptr
                ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
  }
LAB_002c07d9:
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::shared_ptr<myvk::Instance>::~shared_ptr((shared_ptr<myvk::Instance> *)0x2c07f3);
  PVar6.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Instance>)PVar6.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Instance> Instance::Create(const std::vector<const char *> &f_extensions, bool use_validation_layer,
                               PFN_vkDebugUtilsMessengerCallbackEXT debug_callback) {
	auto ret = std::make_shared<Instance>();

	VkApplicationInfo app_info = {VK_STRUCTURE_TYPE_APPLICATION_INFO};
	app_info.apiVersion = VK_API_VERSION_1_3;

	VkInstanceCreateInfo create_info = {VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO};
	create_info.pApplicationInfo = &app_info;

	std::vector<const char *> extensions = f_extensions;
	if (use_validation_layer)
		extensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);

	create_info.enabledExtensionCount = extensions.size();
	create_info.ppEnabledExtensionNames = extensions.data();

	VkValidationFeatureEnableEXT validation_features_enabled[] = {
	    VK_VALIDATION_FEATURE_ENABLE_BEST_PRACTICES_EXT, VK_VALIDATION_FEATURE_ENABLE_SYNCHRONIZATION_VALIDATION_EXT};
	VkValidationFeaturesEXT validation_features = {};
	validation_features.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
	validation_features.enabledValidationFeatureCount =
	    sizeof(validation_features_enabled) / sizeof(VkValidationFeatureEnableEXT);
	validation_features.pEnabledValidationFeatures = validation_features_enabled;

	if (use_validation_layer) {
		create_info.enabledLayerCount = sizeof(kValidationLayers) / sizeof(const char *);
		create_info.ppEnabledLayerNames = kValidationLayers;

		validation_features.pNext = create_info.pNext;
		create_info.pNext = &validation_features;
	} else
		create_info.enabledLayerCount = 0;

	if (vkCreateInstance == nullptr) {
		if (volkInitialize() != VK_SUCCESS)
			return nullptr;
	}

	if (vkCreateInstance(&create_info, nullptr, &ret->m_instance) != VK_SUCCESS)
		return nullptr;
	volkLoadInstanceOnly(ret->m_instance);

	if (use_validation_layer && debug_callback) {
		VkDebugUtilsMessengerCreateInfoEXT debug_info = {};
		debug_info.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
		debug_info.messageSeverity =
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT;
		debug_info.messageType = VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
		debug_info.pfnUserCallback = debug_callback;
		debug_info.pUserData = nullptr;

		if (vkCreateDebugUtilsMessengerEXT(ret->m_instance, &debug_info, nullptr, &ret->m_debug_messenger) !=
		    VK_SUCCESS)
			return nullptr;
	}

	return ret;
}